

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hh
# Opt level: O0

char qpdf::util::hex_decode_char(char digit)

{
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  char digit_local;
  
  if ((digit < ':') && ('/' < digit)) {
    local_a = digit + -0x30;
  }
  else {
    if (digit < 'a') {
      if (digit < 'A') {
        local_c = '\x10';
      }
      else {
        local_c = digit + -0x37;
      }
      local_b = local_c;
    }
    else {
      local_b = digit + -0x57;
    }
    local_a = local_b;
  }
  return local_a;
}

Assistant:

inline constexpr char
    hex_decode_char(char digit)
    {
        return digit <= '9' && digit >= '0'
            ? char(digit - '0')
            : (digit >= 'a' ? char(digit - 'a' + 10)
                            : (digit >= 'A' ? char(digit - 'A' + 10) : '\20'));
    }